

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool local_e2;
  bool local_e1;
  int local_e0 [4];
  bool local_ce;
  bool local_cd;
  int local_cc [5];
  undefined1 local_b8 [8];
  UndoHistory history;
  Cmd cmd4;
  Cmd cmd3;
  undefined1 local_50 [8];
  Cmd cmd2;
  Cmd cmd1;
  int model;
  char **argv_local;
  int argc_local;
  
  cmd1.m_undo_value = 0;
  Cmd::Cmd((Cmd *)&cmd2.m_redo_value,&cmd1.m_undo_value,1,0);
  Cmd::Cmd((Cmd *)local_50,&cmd1.m_undo_value,2,1);
  Cmd::Cmd((Cmd *)&cmd4.m_redo_value,&cmd1.m_undo_value,3,1);
  Cmd::Cmd((Cmd *)&history.m_cur,&cmd1.m_undo_value,4,3);
  undo::UndoHistory::UndoHistory((UndoHistory *)local_b8,(UndoHistoryDelegate *)0x0);
  Cmd::redo((Cmd *)&cmd2.m_redo_value);
  undo::UndoHistory::add((UndoHistory *)local_b8,(UndoCommand *)&cmd2.m_redo_value);
  Cmd::redo((Cmd *)local_50);
  undo::UndoHistory::add((UndoHistory *)local_b8,(UndoCommand *)local_50);
  undo::UndoHistory::undo((UndoHistory *)local_b8);
  Cmd::redo((Cmd *)&cmd4.m_redo_value);
  undo::UndoHistory::add((UndoHistory *)local_b8,(UndoCommand *)&cmd4.m_redo_value);
  Cmd::redo((Cmd *)&history.m_cur);
  undo::UndoHistory::add((UndoHistory *)local_b8,(UndoCommand *)&history.m_cur);
  local_cc[4] = 4;
  expect_eq<int,int>(local_cc + 4,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x20);
  undo::UndoHistory::undo((UndoHistory *)local_b8);
  local_cc[3] = 3;
  expect_eq<int,int>(local_cc + 3,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x22);
  undo::UndoHistory::undo((UndoHistory *)local_b8);
  local_cc[2] = 2;
  expect_eq<int,int>(local_cc + 2,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x24);
  undo::UndoHistory::undo((UndoHistory *)local_b8);
  local_cc[1] = 1;
  expect_eq<int,int>(local_cc + 1,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x26);
  undo::UndoHistory::undo((UndoHistory *)local_b8);
  local_cc[0] = 0;
  expect_eq<int,int>(local_cc,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x28);
  local_cd = false;
  local_ce = undo::UndoHistory::canUndo((UndoHistory *)local_b8);
  expect_eq<bool,bool>
            (&local_cd,&local_ce,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp",0x29);
  undo::UndoHistory::redo((UndoHistory *)local_b8);
  local_e0[3] = 1;
  expect_eq<int,int>(local_e0 + 3,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x2b);
  undo::UndoHistory::redo((UndoHistory *)local_b8);
  local_e0[2] = 2;
  expect_eq<int,int>(local_e0 + 2,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x2d);
  undo::UndoHistory::redo((UndoHistory *)local_b8);
  local_e0[1] = 3;
  expect_eq<int,int>(local_e0 + 1,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x2f);
  undo::UndoHistory::redo((UndoHistory *)local_b8);
  local_e0[0] = 4;
  expect_eq<int,int>(local_e0,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x31);
  local_e1 = false;
  local_e2 = undo::UndoHistory::canRedo((UndoHistory *)local_b8);
  expect_eq<bool,bool>
            (&local_e1,&local_e2,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp",0x32);
  undo::UndoHistory::~UndoHistory((UndoHistory *)local_b8);
  Cmd::~Cmd((Cmd *)&history.m_cur);
  Cmd::~Cmd((Cmd *)&cmd4.m_redo_value);
  Cmd::~Cmd((Cmd *)local_50);
  Cmd::~Cmd((Cmd *)&cmd2.m_redo_value);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
  // 1 --- 2
  // |
  //  ------- 3 --- 4
  int model = 0;
  Cmd cmd1(model, 1, 0);
  Cmd cmd2(model, 2, 1);
  Cmd cmd3(model, 3, 1);
  Cmd cmd4(model, 4, 3);

  UndoHistory history;
  cmd1.redo(); history.add(&cmd1);
  cmd2.redo(); history.add(&cmd2);
  history.undo();
  cmd3.redo(); history.add(&cmd3); // Creates a branch in the history
  cmd4.redo(); history.add(&cmd4);

  EXPECT_EQ(4, model);
  history.undo();
  EXPECT_EQ(3, model);
  history.undo();
  EXPECT_EQ(2, model);
  history.undo();
  EXPECT_EQ(1, model);
  history.undo();
  EXPECT_EQ(0,  model);
  EXPECT_FALSE(history.canUndo());
  history.redo();
  EXPECT_EQ(1, model);
  history.redo();
  EXPECT_EQ(2, model);
  history.redo();
  EXPECT_EQ(3, model);
  history.redo();
  EXPECT_EQ(4,  model);
  EXPECT_FALSE(history.canRedo());
}